

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O0

string * __thiscall
VulkanHppGenerator::generateCommandSetExclusive
          (string *__return_storage_ptr__,VulkanHppGenerator *this,string *name,
          CommandData *commandData,size_t initialSkipCount,bool definition,bool raii)

{
  byte bVar1;
  size_t initialSkipCount_00;
  size_t commandData_00;
  CommandData *name_00;
  CommandFlavourFlags local_139;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_138;
  map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
  local_118;
  string local_e0;
  string local_c0;
  CommandFlavourFlags local_89;
  map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
  local_88;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_58;
  undefined1 local_3a;
  byte local_39;
  bool raii_local;
  size_t sStack_38;
  bool definition_local;
  size_t initialSkipCount_local;
  CommandData *commandData_local;
  string *name_local;
  VulkanHppGenerator *this_local;
  
  local_3a = raii;
  local_39 = definition;
  sStack_38 = initialSkipCount;
  initialSkipCount_local = (size_t)commandData;
  commandData_local = (CommandData *)name;
  name_local = &this->m_api;
  this_local = (VulkanHppGenerator *)__return_storage_ptr__;
  if (raii) {
    local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_58);
    local_88._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    local_88._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_88._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_88._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
    local_88._M_t._M_impl._0_8_ = 0;
    local_88._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_88._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    std::
    map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
    ::map(&local_88);
    bVar1 = local_39;
    Flags<CommandFlavourFlagBits>::Flags(&local_89);
    generateRAIIHandleCommandEnhanced
              (__return_storage_ptr__,this,name,commandData,initialSkipCount,&local_58,&local_88,
               (bool)(bVar1 & 1),local_89);
    std::
    map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
    ::~map(&local_88);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&local_58);
  }
  else {
    generateCommandStandard(&local_c0,this,name,commandData,initialSkipCount,definition);
    name_00 = commandData_local;
    commandData_00 = initialSkipCount_local;
    initialSkipCount_00 = sStack_38;
    bVar1 = local_39;
    local_118._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    local_118._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_118._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_118._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
    local_118._M_t._M_impl._0_8_ = 0;
    local_118._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_118._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    std::
    map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
    ::map(&local_118);
    local_138.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_138.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_138.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_138);
    Flags<CommandFlavourFlagBits>::Flags(&local_139);
    generateCommandEnhanced
              (&local_e0,this,(string *)name_00,(CommandData *)commandData_00,initialSkipCount_00,
               (bool)(bVar1 & 1),&local_118,&local_138,local_139);
    generateCommandSet(__return_storage_ptr__,this,&local_c0,&local_e0);
    std::__cxx11::string::~string((string *)&local_e0);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&local_138);
    std::
    map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
    ::~map(&local_118);
    std::__cxx11::string::~string((string *)&local_c0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string VulkanHppGenerator::generateCommandSetExclusive(
  std::string const & name, CommandData const & commandData, size_t initialSkipCount, bool definition, bool raii ) const
{
  if ( raii )
  {
    return generateRAIIHandleCommandEnhanced( name, commandData, initialSkipCount, {}, {}, definition );
  }
  else
  {
    return generateCommandSet( generateCommandStandard( name, commandData, initialSkipCount, definition ),
                               generateCommandEnhanced( name, commandData, initialSkipCount, definition, {}, {}, {} ) );
  }
}